

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fusion.c
# Opt level: O0

void ctr_transform(ptls_cipher_context_t *_ctx,void *output,void *input,size_t len)

{
  _func_void_st_ptls_cipher_context_t_ptr *p_Var1;
  ulong uVar2;
  size_t sVar3;
  __m128i alVar4;
  ctr_context *ctx;
  size_t len_local;
  void *input_local;
  void *output_local;
  ptls_cipher_context_t *_ctx_local;
  
  if ((*(char *)&_ctx[0x11].do_init != '\0') && (len < 0x11)) {
    *(undefined1 *)&_ctx[0x11].do_init = 0;
    if (len < 0x10) {
      sVar3 = len;
      alVar4 = loadn128(input,len);
      alVar4[0] = alVar4[1];
      alVar4[1] = sVar3;
      storen128(output,len,alVar4);
    }
    else {
      p_Var1 = _ctx[0x11].do_dispose;
      uVar2 = *(ulong *)((long)input + 8);
      *(ulong *)output = (ulong)_ctx[0x11].algo ^ *input;
      *(ulong *)((long)output + 8) = (ulong)p_Var1 ^ uVar2;
    }
    return;
  }
  __assert_fail("(ctx->is_ready && len <= 16) || !\"CTR transfomation is supported only once per call to `init` and the maximum size is limited  to 16 bytes\""
                ,"/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/fusion.c"
                ,0x42d,"void ctr_transform(ptls_cipher_context_t *, void *, const void *, size_t)");
}

Assistant:

static void ctr_transform(ptls_cipher_context_t *_ctx, void *output, const void *input, size_t len)
{
    struct ctr_context *ctx = (struct ctr_context *)_ctx;

    assert((ctx->is_ready && len <= 16) ||
           !"CTR transfomation is supported only once per call to `init` and the maximum size is limited  to 16 bytes");
    ctx->is_ready = 0;

    if (len < 16) {
        storen128(output, len, _mm_xor_si128(_mm_loadu_si128(&ctx->bits), loadn128(input, len)));
    } else {
        _mm_storeu_si128(output, _mm_xor_si128(_mm_loadu_si128(&ctx->bits), _mm_loadu_si128(input)));
    }
}